

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderPrecisionTests.cpp
# Opt level: O3

ShaderProgram *
deqp::gles3::Functional::createIntUintPrecisionEvalProgram
          (RenderContext *context,DataType type,Precision precision,char *evalOp,bool isVertexCase)

{
  int iVar1;
  char *pcVar2;
  char *__s;
  size_t sVar3;
  ShaderProgram *this;
  char *pcVar4;
  ostream *poVar5;
  undefined3 in_register_00000081;
  ostringstream *poVar6;
  long lVar7;
  ostringstream vtx;
  ostringstream frag;
  ProgramSources sources;
  undefined1 auStack_448 [4];
  undefined4 local_444;
  RenderContext *local_440;
  char *local_438;
  value_type local_430;
  value_type local_410;
  undefined1 local_3f0 [376];
  undefined1 local_278 [376];
  ProgramSources local_100;
  
  local_440 = context;
  local_438 = evalOp;
  pcVar2 = glu::getDataTypeName(type);
  __s = glu::getPrecisionName(precision);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
  poVar6 = (ostringstream *)local_278;
  if (isVertexCase) {
    poVar6 = (ostringstream *)local_3f0;
  }
  local_444 = CONCAT31(in_register_00000081,isVertexCase);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,"#version 300 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3f0,"in highp vec4 a_position;\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,"in ",3);
  if (__s == (char *)0x0) {
    std::ios::clear((int)auStack_448 + (int)*(_func_int **)(local_3f0._0_8_ + -0x18) + 0x58);
  }
  else {
    sVar3 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,__s,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0," ",1);
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)auStack_448 + (int)*(_func_int **)(local_3f0._0_8_ + -0x18) + 0x58);
  }
  else {
    sVar3 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,pcVar2,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0," a_in0;\n",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,"in ",3);
  if (__s == (char *)0x0) {
    std::ios::clear((int)auStack_448 + (int)*(_func_int **)(local_3f0._0_8_ + -0x18) + 0x58);
  }
  else {
    sVar3 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,__s,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0," ",1);
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)auStack_448 + (int)*(_func_int **)(local_3f0._0_8_ + -0x18) + 0x58);
  }
  else {
    sVar3 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,pcVar2,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0," a_in1;\n",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"#version 300 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,"layout(location = 0) out ",0x19);
  if (__s == (char *)0x0) {
    std::ios::clear((int)auStack_448 + (int)*(_func_int **)(local_278._0_8_ + -0x18) + 0x1d0);
  }
  else {
    sVar3 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,__s,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278," ",1);
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)auStack_448 + (int)*(_func_int **)(local_278._0_8_ + -0x18) + 0x1d0);
  }
  else {
    sVar3 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar2,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278," o_out;\n",8);
  if ((char)local_444 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,"flat out ",9);
    if (__s == (char *)0x0) {
      std::ios::clear((int)auStack_448 + (int)*(_func_int **)(local_3f0._0_8_ + -0x18) + 0x58);
    }
    else {
      sVar3 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,__s,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0," ",1);
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)auStack_448 + (int)*(_func_int **)(local_3f0._0_8_ + -0x18) + 0x58);
    }
    else {
      sVar3 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,pcVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0," v_in0;\n",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,"flat out ",9);
    if (__s == (char *)0x0) {
      std::ios::clear((int)auStack_448 + (int)*(_func_int **)(local_3f0._0_8_ + -0x18) + 0x58);
    }
    else {
      sVar3 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,__s,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0," ",1);
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)auStack_448 + (int)*(_func_int **)(local_3f0._0_8_ + -0x18) + 0x58);
    }
    else {
      sVar3 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,pcVar2,sVar3);
    }
    pcVar4 = " v_in1;\n";
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0," v_in1;\n",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"flat in ",8);
    if (__s == (char *)0x0) {
      std::ios::clear((int)auStack_448 + (int)*(_func_int **)(local_278._0_8_ + -0x18) + 0x1d0);
    }
    else {
      sVar3 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,__s,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278," ",1);
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)auStack_448 + (int)*(_func_int **)(local_278._0_8_ + -0x18) + 0x1d0);
    }
    else {
      sVar3 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278," v_in0;\n",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"flat in ",8);
    if (__s == (char *)0x0) {
      std::ios::clear((int)auStack_448 + (int)*(_func_int **)(local_278._0_8_ + -0x18) + 0x1d0);
    }
    else {
      sVar3 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,__s,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278," ",1);
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)auStack_448 + (int)*(_func_int **)(local_278._0_8_ + -0x18) + 0x1d0);
    }
    else {
      sVar3 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar2,sVar3);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,"flat out ",9);
    if (__s == (char *)0x0) {
      std::ios::clear((int)auStack_448 + (int)*(_func_int **)(local_3f0._0_8_ + -0x18) + 0x58);
    }
    else {
      sVar3 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,__s,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0," ",1);
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)auStack_448 + (int)*(_func_int **)(local_3f0._0_8_ + -0x18) + 0x58);
    }
    else {
      sVar3 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,pcVar2,sVar3);
    }
    pcVar4 = " v_out;\n";
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0," v_out;\n",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"flat in ",8);
    if (__s == (char *)0x0) {
      std::ios::clear((int)auStack_448 + (int)*(_func_int **)(local_278._0_8_ + -0x18) + 0x1d0);
    }
    else {
      sVar3 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,__s,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278," ",1);
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)auStack_448 + (int)*(_func_int **)(local_278._0_8_ + -0x18) + 0x1d0);
    }
    else {
      sVar3 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar2,sVar3);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar4,8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3f0,"\nvoid main (void)\n{\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3f0,"\tgl_Position = a_position;\n",0x1b);
  poVar5 = (ostream *)local_278;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\nvoid main (void)\n{\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6,"\t",1);
  iVar1 = (int)poVar6;
  if (__s == (char *)0x0) {
    std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
  }
  else {
    sVar3 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6,__s,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6," ",1);
  if (pcVar2 == (char *)0x0) {
    std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
  }
  else {
    sVar3 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6,pcVar2,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6," in0 = ",7);
  pcVar4 = "a_";
  if ((char)local_444 == '\0') {
    pcVar4 = "v_";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6,pcVar4,2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6,"in0;\n",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6,"\t",1);
  if (__s == (char *)0x0) {
    std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
  }
  else {
    sVar3 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6,__s,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6," ",1);
  if (pcVar2 == (char *)0x0) {
    std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
  }
  else {
    sVar3 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6,pcVar2,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6," in1 = ",7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6,pcVar4,2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6,"in1;\n",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6,"\t",1);
  pcVar2 = "o_";
  if ((char)local_444 != '\0') {
    pcVar2 = "v_";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6,pcVar2,2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6,"out = ",6);
  pcVar2 = local_438;
  if (local_438 == (char *)0x0) {
    std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
  }
  else {
    sVar3 = strlen(local_438);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6,pcVar2,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6,";\n",2);
  if ((char)local_444 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3f0,"\tv_in0 = a_in0;\n",0x10);
    pcVar2 = "\tv_in1 = a_in1;\n";
    poVar5 = (ostream *)local_3f0;
  }
  else {
    pcVar2 = "\to_out = v_out;\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar2,0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,"}\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"}\n",2);
  this = (ShaderProgram *)operator_new(0xd0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  memset(&local_100,0,0xac);
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_100._193_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100.sources,&local_410);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100.sources + 1,&local_430);
  glu::ShaderProgram::ShaderProgram(this,local_440,&local_100);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_100.transformFeedbackVaryings);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_100.attribLocationBindings);
  lVar7 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_100.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar7));
    lVar7 = lVar7 + -0x18;
  } while (lVar7 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
  std::ios_base::~ios_base((ios_base *)(local_278 + 0x70));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f0);
  std::ios_base::~ios_base((ios_base *)(local_3f0 + 0x70));
  return this;
}

Assistant:

static glu::ShaderProgram* createIntUintPrecisionEvalProgram (const glu::RenderContext& context, glu::DataType type, glu::Precision precision, const char* evalOp, bool isVertexCase)
{
	const char*		typeName	= glu::getDataTypeName(type);
	const char*		precName	= glu::getPrecisionName(precision);
	ostringstream	vtx;
	ostringstream	frag;
	ostringstream&	op			= isVertexCase ? vtx : frag;

	vtx << "#version 300 es\n"
		<< "in highp vec4 a_position;\n"
		<< "in " << precName << " " << typeName << " a_in0;\n"
		<< "in " << precName << " " << typeName << " a_in1;\n";
	frag << "#version 300 es\n"
		 << "layout(location = 0) out " << precName << " " << typeName << " o_out;\n";

	if (isVertexCase)
	{
		vtx << "flat out " << precName << " " << typeName << " v_out;\n";
		frag << "flat in " << precName << " " << typeName << " v_out;\n";
	}
	else
	{
		vtx << "flat out " << precName << " " << typeName << " v_in0;\n"
			<< "flat out " << precName << " " << typeName << " v_in1;\n";
		frag << "flat in " << precName << " " << typeName << " v_in0;\n"
			 << "flat in " << precName << " " << typeName << " v_in1;\n";
	}

	vtx << "\nvoid main (void)\n{\n"
		<< "	gl_Position = a_position;\n";
	frag << "\nvoid main (void)\n{\n";

	op << "\t" << precName << " " << typeName << " in0 = " << (isVertexCase ? "a_" : "v_") << "in0;\n"
	   << "\t" << precName << " " << typeName << " in1 = " << (isVertexCase ? "a_" : "v_") << "in1;\n";

	op << "\t" << (isVertexCase ? "v_" : "o_") << "out = " << evalOp << ";\n";

	if (isVertexCase)
	{
		frag << "	o_out = v_out;\n";
	}
	else
	{
		vtx << "	v_in0 = a_in0;\n"
			<< "	v_in1 = a_in1;\n";
	}

	vtx << "}\n";
	frag << "}\n";

	return new glu::ShaderProgram(context, glu::makeVtxFragSources(vtx.str(), frag.str()));
}